

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

QSize __thiscall QDialog::minimumSizeHint(QDialog *this)

{
  int iVar1;
  long lVar2;
  QSize QVar3;
  QSize QVar4;
  QSize QVar5;
  ulong uVar6;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long *)(lVar2 + 0x270) == 0) {
    QVar3 = QWidget::minimumSizeHint(&this->super_QWidget);
    uVar6 = (ulong)QVar3 >> 0x20;
  }
  else {
    iVar1 = *(int *)(lVar2 + 0x268);
    QVar3 = QWidget::minimumSizeHint(&this->super_QWidget);
    if (iVar1 == 1) {
      QVar4 = QWidget::minimumSizeHint(&this->super_QWidget);
      QVar5 = (QSize)(**(code **)(**(long **)(lVar2 + 0x270) + 0x78))();
      if (QVar5.ht.m_i.m_i < QVar4.ht.m_i.m_i) {
        QVar5 = QVar4;
      }
      uVar6 = (ulong)QVar5 >> 0x20;
    }
    else {
      QVar5 = (QSize)(**(code **)(**(long **)(lVar2 + 0x270) + 0x78))();
      if (QVar5.wd.m_i.m_i < QVar3.wd.m_i.m_i) {
        QVar5 = QVar3;
      }
      QVar3 = (QSize)((ulong)QVar5 & 0xffffffff);
      QVar5 = QWidget::minimumSizeHint(&this->super_QWidget);
      uVar6 = (ulong)QVar5 >> 0x20;
    }
  }
  return (QSize)((ulong)QVar3 & 0xffffffff | uVar6 << 0x20);
}

Assistant:

QSize QDialog::minimumSizeHint() const
{
    Q_D(const QDialog);
    if (d->extension) {
        if (d->orientation == Qt::Horizontal)
            return QSize(QWidget::minimumSizeHint().width(),
                        qMax(QWidget::minimumSizeHint().height(), d->extension->minimumSizeHint().height()));
        else
            return QSize(qMax(QWidget::minimumSizeHint().width(), d->extension->minimumSizeHint().width()),
                        QWidget::minimumSizeHint().height());
    }

    return QWidget::minimumSizeHint();
}